

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.h
# Opt level: O2

void __thiscall RtMidiError::~RtMidiError(RtMidiError *this)

{
  *(undefined ***)this = &PTR__RtMidiError_00211dc8;
  std::__cxx11::string::~string((string *)&this->message_);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~RtMidiError( void ) throw() {}